

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::predict
          (Model *this,vector<int,_std::allocator<int>_> *input,int32_t k,real threshold,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden,Vector *output)

{
  element_type *peVar1;
  invalid_argument *piVar2;
  iterator __last;
  iterator __comp;
  Model *in_RCX;
  int in_EDX;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RSI;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  Vector *in_R9;
  undefined4 in_XMM0_Da;
  Model *unaff_retaddr;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_stack_00000008;
  real in_stack_00000010;
  int32_t in_stack_00000014;
  real in_stack_00000018;
  int32_t in_stack_0000001c;
  Model *in_stack_00000020;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_stack_ffffffffffffff98;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  
  if (in_EDX == -1) {
    in_EDX = *(int *)(in_RDI + 0xac);
  }
  else if (in_EDX < 1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"k needs to be 1 or higher!");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x191a08);
  if (peVar1->model == sup) {
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::reserve
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)in_R9,
               in_stack_ffffffffffffffc8);
    computeHidden(in_RCX,in_R8,in_R9);
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x191a9c);
    if (peVar1->loss == hs) {
      dfs(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014,in_stack_00000010,
          in_stack_00000008,(Vector *)unaff_retaddr);
    }
    else {
      findKBest(unaff_retaddr,(int32_t)((ulong)in_RDI >> 0x20),(real)in_RDI,in_RSI,
                (Vector *)CONCAT44(in_EDX,in_XMM0_Da),(Vector *)in_RCX);
    }
    __last = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                       (in_stack_ffffffffffffff98);
    __comp = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                       (in_stack_ffffffffffffff98);
    std::
    sort_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
              (in_stack_ffffffffffffffc0,
               (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                )__last._M_current,
               (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)__comp._M_current);
    return;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar2,"Model needs to be supervised for prediction!");
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Model::predict(
		const std::vector<int32_t>& input,
		int32_t k,
		real threshold,
		std::vector<std::pair<real, int32_t>>& heap,
		Vector& hidden,
		Vector& output) const {
	if (k == Model::kUnlimitedPredictions) {
		k = osz_;
	} else if (k <= 0) {
		throw std::invalid_argument("k needs to be 1 or higher!");
	}
	if (args_->model != model_name::sup) {
		throw std::invalid_argument("Model needs to be supervised for prediction!");
	}
	heap.reserve(k + 1);
	computeHidden(input, hidden);
	if (args_->loss == loss_name::hs) {
		dfs(k, threshold, 2 * osz_ - 2, 0.0, heap, hidden);
	} else {
		findKBest(k, threshold, heap, hidden, output);
	}
	std::sort_heap(heap.begin(), heap.end(), comparePairs);
}